

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_iter.cpp
# Opt level: O0

void __thiscall
ON_SubDFaceIterator::ON_SubDFaceIterator
          (ON_SubDFaceIterator *this,ON_SubD *subd,ON_SubDVertex *vertex)

{
  uint face_count_00;
  ON_SubDFace *first;
  ON_SubDFace *last;
  ON_SubDComponentPtr component_ptr;
  ON_SubDRef local_48 [2];
  uint local_24;
  ON_SubDVertex *pOStack_20;
  uint face_count;
  ON_SubDVertex *vertex_local;
  ON_SubD *subd_local;
  ON_SubDFaceIterator *this_local;
  
  pOStack_20 = vertex;
  vertex_local = (ON_SubDVertex *)subd;
  subd_local = (ON_SubD *)this;
  ON_SubDRef::ON_SubDRef(&this->m_subd_ref);
  this->m_face_first = (ON_SubDFace *)0x0;
  this->m_face_last = (ON_SubDFace *)0x0;
  this->m_face_current = (ON_SubDFace *)0x0;
  this->m_face_index = 0;
  this->m_face_count = 0;
  (this->m_component_ptr).m_ptr = 0;
  local_24 = ON_SubDVertex::FaceCount(pOStack_20);
  ON_SubDRef::CreateReferenceForExperts(local_48,(ON_SubD *)vertex_local);
  face_count_00 = local_24;
  first = ON_SubDVertex::Face(pOStack_20,0);
  last = ON_SubDVertex::Face(pOStack_20,local_24 - 1);
  component_ptr = ON_SubDComponentPtr::Create(pOStack_20);
  Internal_Init(this,local_48,face_count_00,first,last,component_ptr);
  ON_SubDRef::~ON_SubDRef(local_48);
  return;
}

Assistant:

ON_SubDFaceIterator::ON_SubDFaceIterator(
  const class ON_SubD& subd,
  const class ON_SubDVertex& vertex
)
{
  const unsigned int face_count = vertex.FaceCount();
  Internal_Init(
    ON_SubDRef::CreateReferenceForExperts(subd),
    face_count,
    vertex.Face(0),
    vertex.Face(face_count - 1),
    ON_SubDComponentPtr::Create(&vertex)
  );
}